

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O0

void FS_Error(char *error,...)

{
  CFraggleScriptError *this;
  char local_428 [8];
  char errortext [1024];
  va_list argptr;
  char *error_local;
  
  errortext[0x3fc] = '0';
  errortext[0x3fd] = '\0';
  errortext[0x3fe] = '\0';
  errortext[0x3ff] = '\0';
  errortext[0x3f8] = '\b';
  errortext[0x3f9] = '\0';
  errortext[0x3fa] = '\0';
  errortext[0x3fb] = '\0';
  myvsnprintf(local_428,0x400,error,(__va_list_tag *)(errortext + 0x3f8));
  this = (CFraggleScriptError *)__cxa_allocate_exception(0x400);
  CFraggleScriptError::CFraggleScriptError(this,local_428);
  __cxa_throw(this,&CFraggleScriptError::typeinfo,0);
}

Assistant:

void FS_Error(const char *error, ...)
{
	va_list argptr;
	char errortext[MAX_ERRORTEXT];

	va_start(argptr, error);
	myvsnprintf(errortext, MAX_ERRORTEXT, error, argptr);
	va_end(argptr);
	throw CFraggleScriptError(errortext);
}